

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c
# Opt level: O2

cf_errno_t cf_mutex_destroy(cf_mutex_t *mutex)

{
  int iVar1;
  
  iVar1 = pthread_mutex_destroy((pthread_mutex_t *)mutex);
  return (cf_errno_t)(iVar1 != 0);
}

Assistant:

cf_errno_t cf_mutex_destroy(cf_mutex_t* mutex) {
#ifdef CF_OS_WIN
    if (!mutex) return CF_EPARAM;   
    return CloseHandle(*mutex) ? CF_OK : CF_NOK;
#else
    if(pthread_mutex_destroy(mutex) == 0) return CF_OK;
    else return CF_NOK;
#endif
}